

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::commitTexturePage
          (SparseTextureClampLookupColorTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  undefined1 *this_00;
  char cVar1;
  GLenum err;
  ostream *poVar2;
  TestError *this_01;
  GLint depth;
  GLint local_44;
  GLint height;
  GLint width;
  long local_38;
  
  this_00 = &(this->super_SparseTextureClampLookupResidencyTestCase).
             super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
             super_SparseTextureCommitmentTestCase.field_0x88;
  local_44 = format;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Commit Region [level: ",0x16);
  poVar2 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] - ",4);
  if ((this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
      super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.levels +
      -1 < level) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
               ,0x3de);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  cVar1 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                 super_SparseTexture2LookupTestCase.
                                 super_SparseTexture2CommitmentTestCase.
                                 super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase
                                 .super_TestNode + 0x68))(this,target,level);
  if ((cVar1 != '\0') &&
     (cVar1 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                     super_SparseTexture2LookupTestCase.
                                     super_SparseTexture2CommitmentTestCase.
                                     super_SparseTextureCommitmentTestCase.super_TestCase.
                                     super_TestCase.super_TestNode + 0x70))(this,target,level),
     cVar1 != '\0')) {
    SparseTextureUtils::getTextureLevelSize
              (target,&(this->super_SparseTextureClampLookupResidencyTestCase).
                       super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                       super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
    if (target == 0x8513) {
      depth = depth * 6;
    }
    gl4cts::Texture::Bind(gl,*texture,target);
    local_38 = *(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                         super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                         super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                         super_TestNode;
    (**(code **)(local_38 + 0x28))(this,gl,target,local_44,texture,level,0,0,0,width,height,depth,1)
    ;
    err = (*gl->getError)();
    glu::checkError(err,"texPageCommitment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x3f1);
    return true;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Skip commitment [level: ",0x18);
  poVar2 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] - ",4);
  return false;
}

Assistant:

bool SparseTextureClampLookupColorTestCase::commitTexturePage(const Functions& gl, GLint target, GLint format,
															  GLuint& texture, GLint level)
{
	mLog << "Commit Region [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	// Avoid not allowed commitments
	if (!isInPageSizesRange(target, level) || !isPageSizesMultiplication(target, level))
	{
		mLog << "Skip commitment [level: " << level << "] - ";
		return false;
	}

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = 6 * depth;

	Texture::Bind(gl, texture, target);
	texPageCommitment(gl, target, format, texture, level, 0, 0, 0, width, height, depth, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texPageCommitment");

	return true;
}